

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Exception::ExceptionMessageMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionMessageMatcher *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ExceptionMessageMatcher *local_18;
  ExceptionMessageMatcher *this_local;
  
  local_18 = this;
  this_local = (ExceptionMessageMatcher *)__return_storage_ptr__;
  std::operator+(&local_38,"exception message matches \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->m_message);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ExceptionMessageMatcher::describe() const {
    return "exception message matches \"" + m_message + "\"";
}